

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

Message * Message::CopyToMemoryMappedFile(int fd)

{
  __off_t _Var1;
  ssize_t sVar2;
  Message *__dest;
  Message *this;
  Message *msg;
  void *map;
  undefined4 local_10;
  int dummyVal;
  int datasize;
  int fd_local;
  
  local_10 = 200;
  dummyVal = fd;
  printf("message size = %d\n",200);
  _Var1 = lseek(dummyVal,200,0);
  if (_Var1 == -1) {
    fprintf(_stderr,"error in lseek\n");
  }
  map._4_4_ = 0;
  sVar2 = write(dummyVal,(void *)((long)&map + 4),1);
  if (sVar2 == -1) {
    fprintf(_stderr,"error in write\n");
  }
  __dest = (Message *)mmap((void *)0x0,200,3,1,dummyVal,0);
  if (__dest == (Message *)0xffffffffffffffff) {
    fprintf(_stderr,"mmap() returned -1\n");
  }
  this = (Message *)operator_new(200);
  Message(this);
  memcpy(__dest,this,200);
  if (this != (Message *)0x0) {
    ~Message(this);
    operator_delete(this,200);
  }
  return __dest;
}

Assistant:

Message *Message::CopyToMemoryMappedFile(int fd)
{
    int datasize = sizeof(Message);
    printf("message size = %d\n", datasize);
    if(lseek(fd, sizeof(Message), SEEK_SET) == (-1))
    {
        fprintf(stderr, "error in lseek\n");
    }
    int dummyVal = 0;
    if(write(fd, (char*)&dummyVal, sizeof(char)) == (-1))
    {
        fprintf(stderr, "error in write\n");
    }
    void *map = mmap(NULL, sizeof(Message), (PROT_READ|PROT_WRITE), MAP_SHARED, fd, 0);
    if(map == (void*)(-1))
    {
        fprintf(stderr, "mmap() returned -1\n");
    }
    Message *msg = new Message();
    memcpy(map, (void*)msg, sizeof(Message));
    delete msg;
    return (Message*)map;
}